

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Encoder.cpp
# Opt level: O2

void __thiscall
Storage::Encodings::MFM::Encoder::output_short(Encoder *this,uint16_t value,uint16_t fuzzy_mask)

{
  vector<bool,_std::allocator<bool>_> *pvVar1;
  ushort uVar2;
  undefined6 in_register_00000012;
  ushort uVar3;
  uint uVar4;
  
  uVar2 = 0xffff;
  if ((int)CONCAT62(in_register_00000012,fuzzy_mask) != 0) {
    if (this->fuzzy_target_ == (vector<bool,_std::allocator<bool>_> *)0x0) {
      __assert_fail("fuzzy_target_",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Storage/Disk/Encodings/MFM/Encoder.cpp"
                    ,0x13e,
                    "virtual void Storage::Encodings::MFM::Encoder::output_short(uint16_t, uint16_t)"
                   );
    }
    pvVar1 = this->target_;
    std::vector<bool,_std::allocator<bool>_>::resize
              (this->fuzzy_target_,
               (ulong)(pvVar1->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
               ((long)(pvVar1->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
               (long)(pvVar1->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8,false);
    uVar2 = ~fuzzy_mask;
  }
  for (uVar4 = 0x8000; uVar3 = (ushort)uVar4, uVar3 != 0; uVar4 = uVar4 >> 1) {
    std::vector<bool,_std::allocator<bool>_>::push_back(this->target_,(uVar3 & value & uVar2) != 0);
    if (fuzzy_mask != 0) {
      std::vector<bool,_std::allocator<bool>_>::push_back
                (this->fuzzy_target_,(uVar3 & fuzzy_mask) != 0);
    }
  }
  return;
}

Assistant:

void Encoder::output_short(uint16_t value, uint16_t fuzzy_mask) {
	const bool write_fuzzy_bits = fuzzy_mask;

	if(write_fuzzy_bits) {
		assert(fuzzy_target_);

		// Zero-fill the bits to date, to cover any shorts written without fuzzy bits,
		// and make sure the value has a 0 anywhere it should be fuzzy.
		fuzzy_target_->resize(target_->size());
		value &= ~fuzzy_mask;
	}

	uint16_t mask = 0x8000;
	while(mask) {
		target_->push_back(value & mask);
		if(write_fuzzy_bits) fuzzy_target_->push_back(fuzzy_mask & mask);
		mask >>= 1;
	}
}